

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.cpp
# Opt level: O3

string * __thiscall
duckdb::OrderByNode::ToString_abi_cxx11_(string *__return_storage_ptr__,OrderByNode *this)

{
  pointer pPVar1;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->expression);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(__return_storage_ptr__,pPVar1);
  if ((this->type == DESCENDING) || (this->type == ASCENDING)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->null_order == NULLS_FIRST) || (this->null_order == NULLS_LAST)) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string OrderByNode::ToString() const {
	auto str = expression->ToString();
	switch (type) {
	case OrderType::ASCENDING:
		str += " ASC";
		break;
	case OrderType::DESCENDING:
		str += " DESC";
		break;
	default:
		break;
	}

	switch (null_order) {
	case OrderByNullType::NULLS_FIRST:
		str += " NULLS FIRST";
		break;
	case OrderByNullType::NULLS_LAST:
		str += " NULLS LAST";
		break;
	default:
		break;
	}
	return str;
}